

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

int __thiscall
ncnn::Layer::forward
          (Layer *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  size_type sVar2;
  const_reference __fn;
  int __flags;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  void *in_R8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_00000008;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_00000010;
  int i;
  Mat *this_00;
  undefined4 in_stack_ffffffffffffff78;
  int iVar3;
  Mat local_68;
  int local_2c;
  long local_28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  if ((*(byte *)((long)in_RDI + 9) & 1) == 0) {
    local_4 = -1;
  }
  else {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
              (in_stack_00000010,in_stack_00000008);
    local_2c = 0;
    while( true ) {
      iVar3 = local_2c;
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
      __flags = (int)sVar2;
      if (__flags <= iVar3) break;
      __fn = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,(long)local_2c)
      ;
      this_00 = &local_68;
      Mat::clone(this_00,(__fn *)__fn,*(void **)(local_28 + 8),__flags,in_R8);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,(long)local_2c);
      Mat::operator=((Mat *)CONCAT44(iVar3,in_stack_ffffffffffffff78),this_00);
      Mat::~Mat((Mat *)0x10dd54);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,(long)local_2c);
      bVar1 = Mat::empty(this_00);
      if (bVar1) {
        return -100;
      }
      local_2c = local_2c + 1;
    }
    local_4 = (**(code **)(*in_RDI + 0x30))(in_RDI,local_20,local_28);
  }
  return local_4;
}

Assistant:

int Layer::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    if (!support_inplace)
        return -1;

    top_blobs = bottom_blobs;
    for (int i = 0; i < (int)top_blobs.size(); i++)
    {
        top_blobs[i] = bottom_blobs[i].clone(opt.blob_allocator);
        if (top_blobs[i].empty())
            return -100;
    }

    return forward_inplace(top_blobs, opt);
}